

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptm_mgau.c
# Opt level: O2

int ptm_mgau_frame_eval(ps_mgau_t *ps,int16 *senone_scores,uint8 *senone_active,
                       int32 n_senone_active,mfcc_t **featbuf,int32 frame,int32 compallsen)

{
  long lVar1;
  uint *puVar2;
  undefined8 *puVar3;
  ptm_topn_t *ppVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  byte bVar7;
  byte bVar8;
  void *__s;
  mfcc_t *pmVar9;
  long lVar10;
  long lVar11;
  float *pfVar12;
  ptm_topn_t *best;
  float *pfVar13;
  uint uVar14;
  ushort uVar15;
  int iVar16;
  char **ppcVar17;
  long lVar18;
  byte *pbVar19;
  long *plVar20;
  int iVar21;
  ulong uVar22;
  size_t __n;
  float *pfVar23;
  uint uVar24;
  ulong uVar25;
  int iVar26;
  char **ppcVar27;
  long lVar28;
  ulong uVar29;
  float *pfVar30;
  float *pfVar31;
  float *pfVar32;
  int iVar33;
  int iVar34;
  int32 intd;
  ulong uVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  float *pfVar39;
  long lVar40;
  long lVar41;
  float *pfVar42;
  ulong uVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  ptm_topn_t *local_38;
  
  iVar26 = *(int *)&ps[6].vt;
  iVar21 = frame % iVar26;
  ppcVar27 = &(ps[5].vt)->name + (long)iVar21 * 2;
  *(char ***)&ps[5].frame_idx = ppcVar27;
  if (ps->frame_idx <= frame) {
    ppcVar17 = &(ps[5].vt)->name + (long)iVar26 * 2;
    if (iVar21 != 0) {
      ppcVar17 = ppcVar27;
    }
    memcpy((void *)**(undefined8 **)*ppcVar27,(void *)**(undefined8 **)ppcVar17[-2],
           (long)(short)ps[4].frame_idx *
           (long)*(int *)(*(long *)&ps[1].frame_idx + 0x24) *
           (long)*(int *)(*(long *)&ps[1].frame_idx + 0x20) * 8);
    __n = (long)((*(int *)(*(long *)&ps[1].frame_idx + 0x20) + 0x1f) / 0x20) << 2;
    __s = *(void **)(*(long *)&ps[5].frame_idx + 8);
    if (compallsen == 0) {
      uVar22 = 0;
      memset(__s,0,__n);
      uVar35 = 0;
      if (0 < n_senone_active) {
        uVar35 = (ulong)(uint)n_senone_active;
      }
      uVar29 = 0;
      for (; uVar35 != uVar22; uVar22 = uVar22 + 1) {
        uVar29 = (uVar29 & 0xffffffff) + (ulong)senone_active[uVar22];
        bVar7 = *(byte *)(*(long *)&ps[2].frame_idx + uVar29);
        puVar2 = (uint *)(*(long *)(*(long *)&ps[5].frame_idx + 8) + (ulong)(bVar7 >> 5) * 4);
        *puVar2 = *puVar2 | 1 << (bVar7 & 0x1f);
      }
    }
    else {
      memset(__s,0xff,__n);
    }
    plVar20 = *(long **)&ps[1].frame_idx;
    for (lVar37 = 0; uVar35 = (ulong)(int)plVar20[4], lVar37 < (long)uVar35; lVar37 = lVar37 + 1) {
      for (lVar36 = 0; lVar36 < *(int *)((long)plVar20 + 0x24); lVar36 = lVar36 + 1) {
        pmVar9 = featbuf[lVar36];
        lVar18 = *(long *)(*(long *)(**(long **)&ps[5].frame_idx + lVar37 * 8) + lVar36 * 8);
        iVar26 = *(int *)(plVar20[6] + lVar36 * 4);
        uVar35 = (long)iVar26 % 4 & 0xffffffff;
        if ((int)((long)iVar26 % 4) < 1) {
          uVar35 = 0;
        }
        for (lVar38 = 0; lVar38 < (short)ps[4].frame_idx; lVar38 = lVar38 + 1) {
          iVar21 = *(int *)(lVar18 + lVar38 * 8);
          plVar20 = *(long **)&ps[1].frame_idx;
          lVar10 = **(long **)(*(long *)(*plVar20 + lVar37 * 8) + lVar36 * 8);
          fVar44 = *(float *)(*(long *)(*(long *)(plVar20[2] + lVar37 * 8) + lVar36 * 8) +
                             (long)iVar21 * 4);
          lVar40 = (long)(iVar21 * iVar26);
          lVar41 = lVar40 * 4;
          lVar11 = **(long **)(*(long *)(plVar20[1] + lVar37 * 8) + lVar36 * 8);
          lVar1 = lVar40 * 4;
          for (lVar28 = 0; uVar22 = uVar35, (int)uVar35 * 4 != (int)lVar28; lVar28 = lVar28 + 4) {
            fVar45 = *(float *)((long)pmVar9 + lVar28) - *(float *)(lVar10 + lVar41 + lVar28);
            fVar44 = fVar44 - fVar45 * fVar45 * *(float *)(lVar11 + lVar1 + lVar28);
            lVar40 = lVar40 + 1;
          }
          for (; (int)uVar22 < iVar26; uVar22 = uVar22 + 4) {
            uVar5 = *(undefined8 *)(lVar10 + lVar40 * 4);
            fVar45 = (float)*(undefined8 *)(pmVar9 + uVar22) - (float)uVar5;
            fVar46 = (float)((ulong)*(undefined8 *)(pmVar9 + uVar22) >> 0x20) -
                     (float)((ulong)uVar5 >> 0x20);
            uVar5 = *(undefined8 *)(lVar10 + 8 + lVar40 * 4);
            fVar47 = (float)*(undefined8 *)(pmVar9 + uVar22 + 2) - (float)uVar5;
            fVar48 = (float)((ulong)*(undefined8 *)(pmVar9 + uVar22 + 2) >> 0x20) -
                     (float)((ulong)uVar5 >> 0x20);
            uVar5 = *(undefined8 *)(lVar11 + lVar40 * 4);
            uVar6 = *(undefined8 *)(lVar11 + 8 + lVar40 * 4);
            fVar44 = (((fVar44 - (float)uVar5 * fVar45 * fVar45) -
                      (float)((ulong)uVar5 >> 0x20) * fVar46 * fVar46) -
                     fVar47 * fVar47 * (float)uVar6) -
                     fVar48 * fVar48 * (float)((ulong)uVar6 >> 0x20);
            lVar40 = lVar40 + 4;
          }
          fVar45 = -2.1474836e+09;
          if (-2.1474836e+09 <= fVar44) {
            fVar45 = fVar44;
          }
          *(int *)(lVar18 + 4 + (long)(int)lVar38 * 8) = (int)fVar45;
          if (lVar38 != 0) {
            uVar5 = *(undefined8 *)(lVar18 + (long)(int)lVar38 * 8);
            for (lVar41 = lVar38; 0 < lVar41; lVar41 = lVar41 + -1) {
              if ((int)fVar45 <= *(int *)(lVar18 + -4 + lVar41 * 8)) goto LAB_0013c6c2;
              *(undefined8 *)(lVar18 + lVar41 * 8) = *(undefined8 *)(lVar18 + -8 + lVar41 * 8);
            }
            lVar41 = 0;
LAB_0013c6c2:
            *(undefined8 *)(lVar18 + (ulong)((uint)lVar41 & 0x7fffffff) * 8) = uVar5;
          }
        }
        plVar20 = *(long **)&ps[1].frame_idx;
      }
    }
    if (frame % (int)*(short *)((long)&ps[4].frame_idx + 2) == 0) {
      for (uVar22 = 0; (long)uVar22 < (long)(int)uVar35; uVar22 = uVar22 + 1) {
        if ((*(uint *)(*(long *)(*(long *)&ps[5].frame_idx + 8) + (uVar22 >> 5 & 0x7ffffff) * 4) >>
             ((uint)uVar22 & 0x1f) & 1) != 0) {
          for (lVar37 = 0; lVar37 < *(int *)((long)plVar20 + 0x24); lVar37 = lVar37 + 1) {
            pfVar12 = (float *)featbuf[lVar37];
            best = *(ptm_topn_t **)
                    (*(long *)(**(long **)&ps[5].frame_idx + uVar22 * 8) + lVar37 * 8);
            lVar18 = (long)(short)ps[4].frame_idx;
            pfVar39 = (float *)**(undefined8 **)(*(long *)(*plVar20 + uVar22 * 8) + lVar37 * 8);
            pfVar42 = (float *)**(undefined8 **)(*(long *)(plVar20[1] + uVar22 * 8) + lVar37 * 8);
            pfVar13 = *(float **)(*(long *)(plVar20[2] + uVar22 * 8) + lVar37 * 8);
            lVar36 = plVar20[5];
            iVar26 = *(int *)(plVar20[6] + lVar37 * 4);
            for (pfVar31 = pfVar13; pfVar31 < pfVar13 + (int)lVar36; pfVar31 = pfVar31 + 1) {
              fVar45 = (float)best[lVar18 + -1].score;
              lVar38 = 0;
              lVar41 = 0;
              iVar21 = 0;
              pfVar23 = pfVar42;
              pfVar30 = pfVar12;
              pfVar32 = pfVar39;
              for (fVar44 = *pfVar31; (iVar21 < iVar26 % 4 && (fVar45 <= fVar44));
                  fVar44 = fVar44 - (fVar46 - fVar47) * (fVar46 - fVar47) * fVar48) {
                fVar46 = *pfVar30;
                pfVar30 = pfVar30 + 1;
                fVar47 = *pfVar32;
                pfVar32 = pfVar32 + 1;
                fVar48 = *pfVar23;
                pfVar23 = pfVar23 + 1;
                iVar21 = iVar21 + 1;
                lVar41 = lVar41 + 4;
                lVar38 = lVar38 + 1;
              }
              for (; ((int)lVar38 < iVar26 && (fVar45 <= fVar44));
                  fVar44 = (((fVar44 - (float)*puVar3 * fVar46 * fVar46) -
                            (float)((ulong)*puVar3 >> 0x20) * fVar47 * fVar47) -
                           fVar48 * fVar48 * (float)uVar5) -
                           fVar49 * fVar49 * (float)((ulong)uVar5 >> 0x20)) {
                uVar5 = *(undefined8 *)((long)pfVar12 + lVar41 + 8);
                fVar46 = (float)*(undefined8 *)((long)pfVar12 + lVar41) -
                         (float)*(undefined8 *)((long)pfVar39 + lVar41);
                fVar47 = (float)((ulong)*(undefined8 *)((long)pfVar12 + lVar41) >> 0x20) -
                         (float)((ulong)*(undefined8 *)((long)pfVar39 + lVar41) >> 0x20);
                uVar6 = *(undefined8 *)((long)pfVar39 + lVar41 + 8);
                fVar48 = (float)uVar5 - (float)uVar6;
                fVar49 = (float)((ulong)uVar5 >> 0x20) - (float)((ulong)uVar6 >> 0x20);
                puVar3 = (undefined8 *)((long)pfVar42 + lVar41);
                uVar5 = *(undefined8 *)((long)pfVar42 + lVar41 + 8);
                lVar41 = lVar41 + 0x10;
                lVar38 = lVar38 + 4;
              }
              pfVar42 = (float *)((long)pfVar42 + lVar41);
              pfVar39 = (float *)((long)pfVar39 + lVar41);
              if ((int)lVar38 < iVar26) {
                pfVar39 = pfVar39 + (iVar26 - lVar38);
                pfVar42 = pfVar42 + (iVar26 - lVar38);
              }
              else if (fVar45 <= fVar44) {
                uVar15 = (ushort)ps[4].frame_idx;
                if ((short)uVar15 < 1) {
                  uVar15 = 0;
                }
                uVar35 = 0;
                do {
                  iVar21 = (int)((ulong)((long)pfVar31 - (long)pfVar13) >> 2);
                  if (uVar15 == uVar35) {
                    if (-2.1474836e+09 <= fVar44) {
                      intd = (int32)fVar44;
                    }
                    else {
                      intd = -0x80000000;
                    }
                    insertion_sort_cb(&local_38,best + lVar18 + -1,best,iVar21,intd);
                    break;
                  }
                  ppVar4 = best + uVar35;
                  uVar35 = uVar35 + 1;
                } while (ppVar4->cw != iVar21);
              }
            }
            plVar20 = *(long **)&ps[1].frame_idx;
          }
          uVar35 = (ulong)*(uint *)(plVar20 + 4);
        }
      }
    }
    for (lVar37 = 0; lVar37 < *(int *)((long)plVar20 + 0x24); lVar37 = lVar37 + 1) {
      uVar24 = *(uint *)(plVar20 + 4);
      if ((int)*(uint *)(plVar20 + 4) < 1) {
        uVar24 = 0;
      }
      iVar26 = -0x20000000;
      for (uVar35 = 0; uVar24 != uVar35; uVar35 = uVar35 + 1) {
        if (((*(uint *)((*(long **)&ps[5].frame_idx)[1] + (uVar35 >> 5 & 0x7ffffff) * 4) >>
              ((uint)uVar35 & 0x1f) & 1) != 0) &&
           (iVar21 = *(int *)(*(long *)(*(long *)(**(long **)&ps[5].frame_idx + uVar35 * 8) +
                                       lVar37 * 8) + 4) >> 10, iVar26 <= iVar21)) {
          iVar26 = iVar21;
        }
      }
      for (uVar35 = 0; uVar35 != uVar24; uVar35 = uVar35 + 1) {
        plVar20 = *(long **)&ps[5].frame_idx;
        if ((*(uint *)(plVar20[1] + (uVar35 >> 5 & 0x7ffffff) * 4) >> ((uint)uVar35 & 0x1f) & 1) !=
            0) {
          for (lVar36 = 0; lVar36 < (short)ps[4].frame_idx; lVar36 = lVar36 + 1) {
            lVar18 = *(long *)(*(long *)(*plVar20 + uVar35 * 8) + lVar37 * 8);
            iVar21 = iVar26 - (*(int *)(lVar18 + 4 + lVar36 * 8) >> 10);
            if (0x5f < iVar21) {
              iVar21 = 0x60;
            }
            *(int *)(lVar18 + 4 + lVar36 * 8) = iVar21;
          }
        }
      }
      plVar20 = *(long **)&ps[1].frame_idx;
    }
  }
  memset(senone_scores,0,(long)*(int *)&ps[2].vt * 2);
  if (compallsen != 0) {
    n_senone_active = *(int32 *)&ps[2].vt;
  }
  uVar35 = (ulong)(uint)n_senone_active;
  if (n_senone_active < 1) {
    uVar35 = 0;
  }
  iVar26 = 0x7fffffff;
  iVar21 = 0;
  for (uVar22 = 0; uVar22 != uVar35; uVar22 = uVar22 + 1) {
    iVar16 = (int)uVar22;
    if (compallsen == 0) {
      iVar16 = iVar21 + (uint)senone_active[uVar22];
    }
    iVar21 = iVar16;
    lVar37 = (long)iVar21;
    bVar7 = *(byte *)(*(long *)&ps[2].frame_idx + lVar37);
    plVar20 = *(long **)&ps[5].frame_idx;
    uVar24 = *(uint *)(*(long *)&ps[1].frame_idx + 0x24);
    uVar29 = (ulong)uVar24;
    if ((int)uVar24 < 1) {
      uVar29 = 0;
    }
    if ((*(uint *)(plVar20[1] + (ulong)(bVar7 >> 5) * 4) >> (bVar7 & 0x1f) & 1) == 0) {
      for (uVar43 = 0; uVar43 != uVar29; uVar43 = uVar43 + 1) {
        uVar15 = (ushort)ps[4].frame_idx;
        if ((short)uVar15 < 1) {
          uVar15 = 0;
        }
        for (uVar25 = 0; uVar15 != uVar25; uVar25 = uVar25 + 1) {
          *(undefined4 *)
           (*(long *)(*(long *)(*plVar20 + (ulong)bVar7 * 8) + uVar43 * 8) + 4 + uVar25 * 8) = 0x60;
        }
      }
    }
    iVar16 = 0;
    for (uVar43 = 0; uVar43 != uVar29; uVar43 = uVar43 + 1) {
      lVar36 = *(long *)(*(long *)(*plVar20 + (ulong)bVar7 * 8) + uVar43 * 8);
      uVar25 = 0;
      uVar15 = (ushort)ps[4].frame_idx;
      if ((short)uVar15 < 1) {
        uVar15 = 0;
      }
      iVar34 = 0;
      for (; uVar15 != uVar25; uVar25 = uVar25 + 1) {
        lVar18 = *(long *)((&(ps[3].vt)->name)[uVar43] + (long)*(int *)(lVar36 + uVar25 * 8) * 8);
        if (ps[4].vt == (ps_mgaufuncs_t *)0x0) {
          pbVar19 = (byte *)(lVar18 + lVar37);
        }
        else {
          bVar8 = *(byte *)(lVar18 + iVar21 / 2);
          uVar24 = bVar8 & 0xf;
          if ((bVar8 & 1) != 0) {
            uVar24 = (uint)(bVar8 >> 4);
          }
          pbVar19 = (byte *)((long)&(ps[4].vt)->name + (ulong)uVar24);
        }
        if (uVar25 == 0) {
          iVar34 = (uint)*pbVar19 + *(int *)(lVar36 + 4);
        }
        else {
          iVar33 = (uint)*pbVar19 + *(int *)(lVar36 + 4 + uVar25 * 8);
          uVar24 = iVar34 - iVar33;
          if (iVar34 < iVar33) {
            iVar33 = iVar34;
          }
          uVar14 = -uVar24;
          if (0 < (int)uVar24) {
            uVar14 = uVar24;
          }
          iVar34 = iVar33 - (uint)*(byte *)(**(long **)&ps[6].frame_idx + (ulong)uVar14);
        }
      }
      iVar16 = iVar16 + iVar34;
    }
    if (iVar16 < iVar26) {
      iVar26 = iVar16;
    }
    senone_scores[lVar37] = (int16)iVar16;
  }
  uVar22 = 0;
  uVar35 = (ulong)*(uint *)&ps[2].vt;
  if ((int)*(uint *)&ps[2].vt < 1) {
    uVar35 = uVar22;
  }
  for (; uVar35 != uVar22; uVar22 = uVar22 + 1) {
    senone_scores[uVar22] = senone_scores[uVar22] - (short)iVar26;
  }
  return 0;
}

Assistant:

int32
ptm_mgau_frame_eval(ps_mgau_t *ps,
                    int16 *senone_scores,
                    uint8 *senone_active,
                    int32 n_senone_active,
                    mfcc_t ** featbuf, int32 frame,
                    int32 compallsen)
{
    ptm_mgau_t *s = (ptm_mgau_t *)ps;
    int fast_eval_idx;

    /* Find the appropriate frame in the rotating history buffer
     * corresponding to the requested input frame.  No bounds checking
     * is done here, which just means you'll get semi-random crap if
     * you request a frame in the future or one that's too far in the
     * past.  Since the history buffer is just used for fast match
     * that might not be fatal. */
    fast_eval_idx = frame % s->n_fast_hist;
    s->f = s->hist + fast_eval_idx;
    /* Compute the top-N codewords for every codebook, unless this
     * is a past frame, in which case we already have them (we
     * hope!) */
    if (frame >= ps_mgau_base(ps)->frame_idx) {
        ptm_fast_eval_t *lastf;
        /* Get the previous frame's top-N information (on the
         * first frame of the input this is just all WORST_DIST,
         * no harm in that) */
        if (fast_eval_idx == 0)
            lastf = s->hist + s->n_fast_hist - 1;
        else
            lastf = s->hist + fast_eval_idx - 1;
        /* Copy in initial top-N info */
        memcpy(s->f->topn[0][0], lastf->topn[0][0],
               s->g->n_mgau * s->g->n_feat * s->max_topn * sizeof(ptm_topn_t));
        /* Generate initial active codebook list (this might not be
         * necessary) */
        ptm_mgau_calc_cb_active(s, senone_active, n_senone_active, compallsen);
        /* Now evaluate top-N, prune, and evaluate remaining codebooks. */
        ptm_mgau_codebook_eval(s, featbuf, frame);
        ptm_mgau_codebook_norm(s, featbuf, frame);
    }
    /* Evaluate intersection of active senones and active codebooks. */
    ptm_mgau_senone_eval(s, senone_scores, senone_active,
                         n_senone_active, compallsen);

    return 0;
}